

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O3

bool __thiscall QMarkdownTextEdit::handleReturnEntered(QMarkdownTextEdit *this)

{
  QArrayData *pQVar1;
  int *piVar2;
  QRegularExpression QVar3;
  char cVar4;
  MoveMode MVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 *puVar8;
  int iVar9;
  QRegularExpressionMatch *this_00;
  ulong uVar10;
  bool bVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QStringView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QString whitespaces;
  QRegularExpression regex;
  QRegularExpressionMatchIterator iterator;
  QString realListCharacter;
  QTextCursor cursor;
  QString t_1;
  QString t;
  QString currentLine;
  QString listCharacter;
  QRegularExpressionMatch match_2;
  QRegularExpressionMatch match;
  QString whitespaceCharacter;
  QRegularExpressionMatch match_1;
  QString currentLineText;
  QRegularExpression local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  qsizetype local_138;
  QRegularExpression local_128;
  QArrayData *local_120;
  QString local_118;
  char *local_100;
  QTextCursor local_f0 [8];
  QString local_e8;
  QString local_d0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long local_a8;
  QString local_98;
  QRegularExpressionMatch local_80 [8];
  QArrayData *local_78;
  char16_t *local_70;
  qsizetype qStack_68;
  QArrayData *local_60;
  char16_t *local_58;
  qsizetype qStack_50;
  QRegularExpression local_48 [3];
  QArrayData *local_30 [3];
  
  cVar4 = QPlainTextEdit::isReadOnly();
  if (cVar4 != '\0') {
    return true;
  }
  QPlainTextEdit::textCursor();
  MVar5 = QTextCursor::position();
  QTextCursor::movePosition((MoveOperation)local_f0,4,1);
  QTextCursor::selectedText();
  QVar12.m_data = (storage_type *)0x2a;
  QVar12.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar12);
  local_b8 = local_118.d.d._0_4_;
  uStack_b4 = local_118.d.d._4_4_;
  uStack_b0 = local_118.d.ptr._0_4_;
  uStack_ac = local_118.d.ptr._4_4_;
  QRegularExpression::QRegularExpression(&local_128,&local_b8,0);
  piVar2 = (int *)CONCAT44(uStack_b4,local_b8);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),2,8);
    }
  }
  QRegularExpression::globalMatch(&local_120,&local_128,local_30,0,0,0);
  cVar4 = QRegularExpressionMatchIterator::hasNext();
  if (cVar4 == '\0') {
    QVar13.m_data = (storage_type *)0x18;
    QVar13.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar13);
    local_b8 = local_118.d.d._0_4_;
    uStack_b4 = local_118.d.d._4_4_;
    uStack_b0 = local_118.d.ptr._0_4_;
    uStack_ac = local_118.d.ptr._4_4_;
    local_a8 = CONCAT44(local_118.d.size._4_4_,(undefined4)local_118.d.size);
    QRegularExpression::QRegularExpression(&local_148,&local_b8,0);
    QVar3.d.d = local_128.d.d;
    local_128.d.d = local_148.d.d;
    local_148.d.d = QVar3.d.d;
    QRegularExpression::~QRegularExpression(&local_148);
    piVar2 = (int *)CONCAT44(uStack_b4,local_b8);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),2,8);
      }
    }
    QRegularExpression::globalMatch(&local_118,&local_128,local_30,0,0,0);
    pQVar1 = (QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
    local_118.d.d._0_4_ = SUB84(local_120,0);
    local_118.d.d._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
    local_120 = pQVar1;
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_118);
    cVar4 = QRegularExpressionMatchIterator::hasNext();
    if (cVar4 == '\0') {
      QString::trimmed_helper((QString *)&local_b8);
      iVar9 = (int)&local_148;
      if (local_a8 < 1) {
LAB_00113a53:
        QVar17.m_data = (storage_type *)0x19;
        QVar17.m_size = (qsizetype)&local_118;
        QString::fromUtf8(QVar17);
        local_148.d.d._4_4_ = local_118.d.d._4_4_;
        local_148.d.d._0_4_ = local_118.d.d._0_4_;
        uStack_140 = local_118.d.ptr._0_4_;
        uStack_13c = local_118.d.ptr._4_4_;
        local_138 = CONCAT44(local_118.d.size._4_4_,(undefined4)local_118.d.size);
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_148,0);
        QVar3.d.d = local_128.d.d;
        local_128.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
          LOCK();
          *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
          UNLOCK();
          if (*(int *)local_148.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_118,&local_128,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
        local_118.d.d._0_4_ = SUB84(local_120,0);
        local_118.d.d._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
        local_120 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_118);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_118);
          QRegularExpressionMatch::captured(iVar9);
          QVar18.m_data._4_4_ = uStack_13c;
          QVar18.m_data._0_4_ = uStack_140;
          QVar18.m_size = local_138;
          uVar6 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
          uVar10 = 0;
          if (uVar6 < 0x100000000) {
            uVar10 = uVar6;
          }
          if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
            LOCK();
            *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
            UNLOCK();
            if (*(int *)local_148.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
            }
          }
          QRegularExpressionMatch::captured(iVar9);
          QRegularExpressionMatch::captured((int)&local_98);
          QTextCursor::setPosition((int)local_f0,MVar5);
          QVar19.m_data = (storage_type *)0x1;
          QVar19.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar19);
          QString::append((QString *)&local_78);
          QString::number((uint)local_48,(int)uVar10 + 1);
          local_d0.d.d = (Data *)local_78;
          local_d0.d.ptr = local_70;
          local_d0.d.size = qStack_68;
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QString *)&local_d0);
          local_e8.d.d = local_d0.d.d;
          local_e8.d.ptr = local_d0.d.ptr;
          local_e8.d.size = local_d0.d.size;
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QString *)&local_e8);
          local_60 = &(local_e8.d.d)->super_QArrayData;
          local_58 = local_e8.d.ptr;
          qStack_50 = local_e8.d.size;
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QString *)&local_60);
          QTextCursor::insertText((QString *)local_f0);
          if (local_60 != (QArrayData *)0x0) {
            LOCK();
            (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60,2,8);
            }
          }
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
            }
          }
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_48[0].d.d != (QRegularExpressionPrivate *)0x0) {
            LOCK();
            *(int *)local_48[0].d.d = *(int *)local_48[0].d.d + -1;
            UNLOCK();
            if (*(int *)local_48[0].d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_48[0].d.d,2,8);
            }
          }
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          QPlainTextEdit::ensureCursorVisible();
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
            LOCK();
            *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
            UNLOCK();
            if (*(int *)local_148.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
            }
          }
          piVar2 = (int *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_),2,8);
            }
          }
          this_00 = local_80;
          goto LAB_00113f83;
        }
        QVar20.m_data = (storage_type *)0x6;
        QVar20.m_size = (qsizetype)&local_118;
        QString::fromUtf8(QVar20);
        local_148.d.d._4_4_ = local_118.d.d._4_4_;
        local_148.d.d._0_4_ = local_118.d.d._0_4_;
        uStack_140 = local_118.d.ptr._0_4_;
        uStack_13c = local_118.d.ptr._4_4_;
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_148,0);
        QVar3.d.d = local_128.d.d;
        local_128.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
          LOCK();
          *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
          UNLOCK();
          if (*(int *)local_148.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_118,&local_128,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
        local_118.d.d._0_4_ = SUB84(local_120,0);
        local_118.d.d._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
        local_120 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_118);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_118);
          QTextCursor::setPosition((int)local_f0,MVar5);
          QVar21.m_data = (storage_type *)0x1;
          QVar21.m_size = (qsizetype)&local_148;
          QString::fromUtf8(QVar21);
          QString::append((QString *)&local_148);
          QTextCursor::insertText((QString *)local_f0);
          if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
            LOCK();
            *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
            UNLOCK();
            if (*(int *)local_148.d.d == 0) {
              QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
            }
          }
          QPlainTextEdit::ensureCursorVisible();
          piVar2 = (int *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_),2,8);
            }
          }
          this_00 = (QRegularExpressionMatch *)&local_98;
          goto LAB_00113f83;
        }
        bVar11 = false;
      }
      else {
        if (local_a8 == 1) {
          bVar11 = false;
        }
        else {
          bVar11 = ((ushort *)CONCAT44(uStack_ac,uStack_b0))[1] == 0x20;
        }
        uVar7 = (uint)*(ushort *)CONCAT44(uStack_ac,uStack_b0);
        if (((0x2d < uVar7) || ((0x2c0000000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) || (!bVar11))
        goto LAB_00113a53;
        QVar14.m_data = (storage_type *)0x29;
        QVar14.m_size = (qsizetype)&local_118;
        QString::fromUtf8(QVar14);
        local_148.d.d._4_4_ = local_118.d.d._4_4_;
        local_148.d.d._0_4_ = local_118.d.d._0_4_;
        uStack_140 = local_118.d.ptr._0_4_;
        uStack_13c = local_118.d.ptr._4_4_;
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_98,&local_148,0);
        QVar3.d.d = local_128.d.d;
        local_128.d.d =
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_98.d.d;
        local_98.d.d = (Data *)QVar3.d.d;
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_98);
        if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
          LOCK();
          *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
          UNLOCK();
          if (*(int *)local_148.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
          }
        }
        QRegularExpression::globalMatch(&local_118,&local_128,local_30,0,0,0);
        pQVar1 = (QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
        local_118.d.d._0_4_ = SUB84(local_120,0);
        local_118.d.d._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
        local_120 = pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_118);
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 == '\0') goto LAB_00113a53;
        QRegularExpressionMatchIterator::next();
        QRegularExpressionMatch::captured(iVar9);
        QRegularExpressionMatch::captured((int)&local_98);
        QRegularExpressionMatch::captured((int)&local_60);
        QVar15.m_data = (storage_type *)0x17;
        QVar15.m_size = (qsizetype)&local_118;
        QString::fromUtf8(QVar15);
        local_e8.d.d = (Data *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
        QRegularExpression::QRegularExpression(local_48,&local_e8,0);
        QRegularExpression::globalMatch(&local_d0,local_48,&local_98,0,0,0);
        pQVar1 = local_120;
        local_120 = &(local_d0.d.d)->super_QArrayData;
        local_d0.d.d = (Data *)pQVar1;
        QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                  ((QRegularExpressionMatchIterator *)&local_d0);
        QRegularExpression::~QRegularExpression(local_48);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
          }
        }
        cVar4 = QRegularExpressionMatchIterator::hasNext();
        if (cVar4 != '\0') {
          QRegularExpressionMatchIterator::next();
          QRegularExpressionMatch::captured((int)&local_118);
          local_d0.d.d = (Data *)0x0;
          local_d0.d.ptr = L" [ ]";
          local_d0.d.size = 4;
          operator+(&local_e8,&local_118,&local_d0);
          QString::operator=(&local_98,(QString *)&local_e8);
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
            }
          }
          if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
            }
          }
          piVar2 = (int *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_),2,8);
            }
          }
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_48);
        }
        QTextCursor::setPosition((int)local_f0,MVar5);
        QVar16.m_data = (storage_type *)0x1;
        QVar16.m_size = (qsizetype)&local_d0;
        QString::fromUtf8(QVar16);
        QString::append((QString *)&local_d0);
        local_e8.d.d = local_d0.d.d;
        local_e8.d.ptr = local_d0.d.ptr;
        local_e8.d.size = local_d0.d.size;
        if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append((QString *)&local_e8);
        local_118.d.d._0_4_ = SUB84(local_e8.d.d,0);
        local_118.d.d._4_4_ = (undefined4)((ulong)local_e8.d.d >> 0x20);
        local_118.d.ptr._0_4_ = SUB84(local_e8.d.ptr,0);
        local_118.d.ptr._4_4_ = (undefined4)((ulong)local_e8.d.ptr >> 0x20);
        local_118.d.size._0_4_ = (undefined4)local_e8.d.size;
        local_118.d.size._4_4_ = (undefined4)((ulong)local_e8.d.size >> 0x20);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append((QString *)&local_118);
        QTextCursor::insertText((QString *)local_f0);
        piVar2 = (int *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_118.d.d._4_4_,local_118.d.d._0_4_),2,8);
          }
        }
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,8);
          }
        }
        QPlainTextEdit::ensureCursorVisible();
        if (local_60 != (QArrayData *)0x0) {
          LOCK();
          (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60,2,8);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_148.d.d != (QRegularExpressionPrivate *)0x0) {
          LOCK();
          *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
          UNLOCK();
          if (*(int *)local_148.d.d == 0) {
            QArrayData::deallocate((QArrayData *)local_148.d.d,2,8);
          }
        }
        this_00 = (QRegularExpressionMatch *)&local_78;
LAB_00113f83:
        QRegularExpressionMatch::~QRegularExpressionMatch(this_00);
        bVar11 = true;
      }
      piVar2 = (int *)CONCAT44(uStack_b4,local_b8);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),2,8);
        }
      }
      goto LAB_0011354f;
    }
    local_118.d.d._0_4_ = 2;
    local_118.d.d._4_4_ = 0;
    local_118.d.ptr._0_4_ = 0;
    local_118.d.ptr._4_4_ = 0;
    local_118.d.size._0_4_ = 0;
    local_118.d.size._4_4_ = 0;
    local_100 = "default";
    QMessageLogger::debug();
    QTextCursor::selectedText();
    puVar8 = (undefined8 *)CONCAT44(uStack_ac,uStack_b0);
    if (puVar8 == (undefined8 *)0x0) {
      puVar8 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_148,(ulong)puVar8);
    if ((char)(((QArrayData *)((long)local_148.d.d + 0x30))->ref_)._q_value.super___atomic_base<int>
              ._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_148.d.d,' ');
    }
    piVar2 = (int *)CONCAT44(uStack_b4,local_b8);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),2,8);
      }
    }
    QDebug::~QDebug((QDebug *)&local_148);
  }
  bVar11 = true;
  QTextCursor::removeSelectedText();
LAB_0011354f:
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)&local_120);
  QRegularExpression::~QRegularExpression(&local_128);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  QTextCursor::~QTextCursor(local_f0);
  return bVar11;
}

Assistant:

bool QMarkdownTextEdit::handleReturnEntered() {
    if (isReadOnly()) {
        return true;
    }

    QTextCursor cursor = this->textCursor();
    const int position = cursor.position();

    cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    const QString currentLineText = cursor.selectedText();

    // if return is pressed and there is just an unordered list symbol then we
    // want to remove the list symbol Valid listCharacters: '+ ', '-' , '* ', '+
    // [ ] ', '+ [x] ', '- [ ] ', '- [x] ', '* [ ] ', '* [x] '.
    QRegularExpression regex(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+)$)");
    QRegularExpressionMatchIterator iterator =
        regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        cursor.removeSelectedText();
        return true;
    }

    // if return is pressed and there is just an ordered list symbol then we
    // want to remove the list symbol
    regex = QRegularExpression(R"(^(\s*)(\d+[\.|\)])(\s+)$)");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        qDebug() << cursor.selectedText();
        cursor.removeSelectedText();
        return true;
    }

    // Check if we are in an unordered list.
    // We are in a list when we have '* ', '- ' or '+ ', possibly with preceding
    // whitespace. If e.g. user has entered '**text**' and pressed enter - we
    // don't want do anymore list-stuff.
    QString currentLine = currentLineText.trimmed();
    QChar char0;
    QChar char1;
    if (currentLine.length() >= 1)
        char0 = currentLine.at(0);
    if (currentLine.length() >= 2)
        char1 = currentLine.at(1);
    const bool inList =
        ((char0 == QLatin1Char('*') || char0 == QLatin1Char('-') ||
          char0 == QLatin1Char('+')) &&
         char1 == QLatin1Char(' '));

    if (inList) {
        // if the current line starts with a list character (possibly after
        // whitespaces) add the whitespaces at the next line too
        // Valid listCharacters: '+ ', '-' , '* ', '+ [ ] ', '+ [x] ', '- [ ] ',
        // '- [x] ', '* [ ] ', '* [x] '.
        regex =
            QRegularExpression(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+))");
        iterator = regex.globalMatch(currentLineText);
        if (iterator.hasNext()) {
            const QRegularExpressionMatch match = iterator.next();
            const QString whitespaces = match.captured(1);
            QString listCharacter = match.captured(2);
            const QString whitespaceCharacter = match.captured(4);

            // start new checkbox list item with an unchecked checkbox
            iterator = QRegularExpression(R"(^([+|\-|\*]) \[(x| |)\])")
                           .globalMatch(listCharacter);
            if (iterator.hasNext()) {
                const QRegularExpressionMatch match = iterator.next();
                const QString realListCharacter = match.captured(1);
                listCharacter = realListCharacter + QStringLiteral(" [ ]");
            }

            cursor.setPosition(position);
            cursor.insertText("\n" + whitespaces + listCharacter +
                              whitespaceCharacter);

            // scroll to the cursor if we are at the bottom of the document
            ensureCursorVisible();
            return true;
        }
    }

    // check for ordered lists and increment the list number in the next line
    regex = QRegularExpression(R"(^(\s*)(\d+)([\.|\)])(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);
        const uint listNumber = match.captured(2).toUInt();
        const QString listMarker = match.captured(3);
        const QString whitespaceCharacter = match.captured(4);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces + QString::number(listNumber + 1) +
                          listMarker + whitespaceCharacter);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    // intent next line with same whitespaces as in current line
    regex = QRegularExpression(R"(^(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    return false;
}